

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZipCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::ZipCompressor::compress(ZipCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  int in_EDX;
  long in_RDI;
  undefined8 *in_R8;
  int outSize;
  Zip *in_stack_00000030;
  undefined4 local_4;
  
  if (in_EDX == 0) {
    *in_R8 = *(undefined8 *)(in_RDI + 0x18);
    local_4 = 0;
  }
  else {
    local_4 = Zip::compress(in_stack_00000030,(char *)this,inPtr._4_4_,(char *)CONCAT44(inSize,minY)
                           );
    *in_R8 = *(undefined8 *)(in_RDI + 0x18);
  }
  return local_4;
}

Assistant:

int
ZipCompressor::compress (const char *inPtr,
			 int inSize,
			 int minY,
			 const char *&outPtr)
{
    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    int outSize = _zip.compress(inPtr, inSize, _outBuffer);

    outPtr = _outBuffer;
    return outSize;
}